

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

Page * pager_get_hot_pages(Pager *pPager)

{
  Page *pPVar1;
  uint local_12c;
  Page *pPStack_128;
  sxu32 i;
  Page *pIn;
  Page *p;
  Page *a [32];
  Pager *pPager_local;
  
  if (pPager->pFirstHot == (Page *)0x0) {
    pPager_local = (Pager *)0x0;
  }
  else {
    a[0x1f] = (Page *)pPager;
    SyZero(&p,0x100);
    pPStack_128 = a[0x1f][5].pPrev;
    while (pPStack_128 != (Page *)0x0) {
      pIn = pPStack_128;
      pPVar1 = pPStack_128->pPrevHot;
      pPStack_128->pPrevHot = (Page *)0x0;
      for (local_12c = 0; local_12c < 0x1f; local_12c = local_12c + 1) {
        if (a[(ulong)local_12c - 1] == (Page *)0x0) {
          a[(ulong)local_12c - 1] = pIn;
          break;
        }
        pIn = page_merge_hot(a[(ulong)local_12c - 1],pIn);
        a[(ulong)local_12c - 1] = (Page *)0x0;
      }
      pPStack_128 = pPVar1;
      if (local_12c == 0x1f) {
        a[0x1e] = page_merge_hot(a[0x1e],pIn);
      }
    }
    pIn = p;
    for (local_12c = 1; local_12c < 0x20; local_12c = local_12c + 1) {
      pIn = page_merge_hot(pIn,a[(ulong)local_12c - 1]);
    }
    pIn->pNextHot = (Page *)0x0;
    pPager_local = (Pager *)pIn;
  }
  return (Page *)pPager_local;
}

Assistant:

static Page * pager_get_hot_pages(Pager *pPager)
{
	Page *a[N_SORT_BUCKET], *p, *pIn;
	sxu32 i;
	if( pPager->pFirstHot == 0 ){
		/* Don't bother sorting, the list is already empty */
		return 0;
	}
	SyZero(a, sizeof(a));
	/* Point to the first inserted entry */
	pIn = pPager->pFirstHot;
	while( pIn ){
		p = pIn;
		pIn = p->pPrevHot;
		p->pPrevHot = 0;
		for(i=0; i<N_SORT_BUCKET-1; i++){
			if( a[i]==0 ){
				a[i] = p;
				break;
			}else{
				p = page_merge_hot(a[i], p);
				a[i] = 0;
			}
		}
		if( i==N_SORT_BUCKET-1 ){
			/* To get here, there need to be 2^(N_SORT_BUCKET) elements in he input list.
			 * But that is impossible.
			 */
			a[i] = page_merge_hot(a[i], p);
		}
	}
	p = a[0];
	for(i=1; i<N_SORT_BUCKET; i++){
		p = page_merge_hot(p,a[i]);
	}
	p->pNextHot = 0;
	return p;
}